

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O2

BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> * __thiscall
gmlc::containers::
DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::find
          (BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>
           *__return_storage_ptr__,
          DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
          *this,GlobalFederateId *searchValue)

{
  const_iterator cVar1;
  ptrdiff_t local_40;
  const_iterator local_38;
  
  cVar1 = std::
          _Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalFederateId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->lookup2)._M_h,searchValue);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false>.
      _M_cur == (__node_type *)0x0) {
    StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
              (__return_storage_ptr__,&this->dataStorage);
  }
  else {
    StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::begin
              (&local_38,&this->dataStorage);
    local_40 = *(ptrdiff_t *)
                ((long)cVar1.
                       super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false>
                       ._M_cur + 0x10);
    __return_storage_ptr__->offset = local_38.offset;
    *(undefined4 *)&__return_storage_ptr__->field_0x14 = local_38._20_4_;
    __return_storage_ptr__->vec = local_38.vec;
    __return_storage_ptr__->ptr = local_38.ptr;
    BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::operator+=
              (__return_storage_ptr__,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

auto find(const searchType2& searchValue) const
        {
            auto fnd = lookup2.find(searchValue);
            if (fnd != lookup2.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }